

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_fetch(gz_state *state)

{
  int iVar1;
  int *in_RDI;
  zng_stream *strm;
  gz_state *in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  int *piVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  piVar2 = in_RDI + 0x20;
  do {
    iVar1 = in_RDI[0x11];
    if (iVar1 == 0) {
      iVar1 = gz_look(in_stack_ffffffffffffffd8);
      if (iVar1 == -1) {
        return -1;
      }
      if (in_RDI[0x11] == 0) {
        return 0;
      }
    }
    else {
      if (iVar1 == 1) {
        iVar1 = gz_load((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (uchar *)in_RDI,(uint)((ulong)piVar2 >> 0x20),
                        (uint *)CONCAT44(1,CONCAT13(in_stack_ffffffffffffffe3,
                                                    CONCAT12(in_stack_ffffffffffffffe2,
                                                             in_stack_ffffffffffffffe0))));
        if (iVar1 == -1) {
          return -1;
        }
        *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RDI + 0xe);
        return 0;
      }
      if (iVar1 == 2) {
        piVar2[8] = in_RDI[10] << 1;
        *(undefined8 *)(piVar2 + 6) = *(undefined8 *)(in_RDI + 0xe);
        iVar1 = gz_decomp((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (iVar1 == -1) {
          return -1;
        }
      }
    }
    in_stack_ffffffffffffffe3 = false;
    if ((*in_RDI == 0) &&
       (in_stack_ffffffffffffffe2 = true, in_stack_ffffffffffffffe3 = in_stack_ffffffffffffffe2,
       in_RDI[0x14] != 0)) {
      in_stack_ffffffffffffffe2 = piVar2[2] != 0;
      in_stack_ffffffffffffffe3 = in_stack_ffffffffffffffe2;
    }
    if ((bool)in_stack_ffffffffffffffe3 == false) {
      return 0;
    }
  } while( true );
}

Assistant:

static int gz_fetch(gz_state *state) {
    PREFIX3(stream) *strm = &(state->strm);

    do {
        switch (state->how) {
        case LOOK:      /* -> LOOK, COPY (only if never GZIP), or GZIP */
            if (gz_look(state) == -1)
                return -1;
            if (state->how == LOOK)
                return 0;
            break;
        case COPY:      /* -> COPY */
            if (gz_load(state, state->out, state->size << 1, &(state->x.have))
                    == -1)
                return -1;
            state->x.next = state->out;
            return 0;
        case GZIP:      /* -> GZIP or LOOK (if end of gzip stream) */
            strm->avail_out = state->size << 1;
            strm->next_out = state->out;
            if (gz_decomp(state) == -1)
                return -1;
        }
    } while (state->x.have == 0 && (!state->eof || strm->avail_in));
    return 0;
}